

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool GlobOpt::DoTypedArrayTypeSpec(Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeProfileInfo *this;
  
  sourceContextId = Func::GetSourceContextId(func);
  functionId = Func::GetLocalFunctionId(func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,TypedArrayTypeSpecPhase,sourceContextId,functionId);
  if ((!bVar1) && (bVar1 = IsTypeSpecPhaseOff(func), !bVar1)) {
    bVar1 = Func::HasProfileInfo(func);
    if (!bVar1) {
      return true;
    }
    this = Func::GetReadOnlyProfileInfo(func);
    bVar1 = Func::IsLoopBody(func);
    bVar1 = JITTimeProfileInfo::IsTypedArrayTypeSpecDisabled(this,bVar1);
    return !bVar1;
  }
  return false;
}

Assistant:

bool
GlobOpt::DoTypedArrayTypeSpec(Func const * func)
{
    return !PHASE_OFF(Js::TypedArrayTypeSpecPhase, func) &&
        !IsTypeSpecPhaseOff(func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsTypedArrayTypeSpecDisabled(func->IsLoopBody()))
#if defined(_M_IX86)
        && AutoSystemInfo::Data.SSE2Available()
#endif
        ;
}